

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_12,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_e8;
  Matrix<float,_3,_4> local_d0;
  Vector<float,_3> local_a0 [2];
  undefined1 local_88 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,12>
              ((Mat4x3 *)(in1.m_data.m_data[3].m_data + 2),(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,12>
              ((Mat4x3 *)(in1.m_data.m_data[3].m_data + 2),(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)0x0,in_ECX);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              ((Mat4 *)local_88,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x1,in_ECX);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,13>
              ((Mat4 *)local_88,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x1,in_ECX);
  }
  tcu::operator*(&local_d0,(Matrix<float,_3,_4> *)(in1.m_data.m_data[3].m_data + 2),
                 (Matrix<float,_4,_4> *)local_88);
  reduceToVec3((MatrixCaseUtils *)local_a0,&local_d0);
  tcu::Vector<float,_4>::xyz(&local_e8,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_e8,local_a0);
  tcu::Matrix<float,_3,_4>::~Matrix(&local_d0);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_88);
  tcu::Matrix<float,_3,_4>::~Matrix((Matrix<float,_3,_4> *)(in1.m_data.m_data[3].m_data + 2));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}